

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry.c
# Opt level: O2

parser_error parse_entry_shortened_label(parser *p)

{
  ulong uVar1;
  _Bool _Var2;
  long *plVar3;
  char *pcVar4;
  size_t sVar5;
  parser_error pVar6;
  ulong uVar7;
  wchar_t wVar8;
  wchar_t n;
  
  plVar3 = (long *)parser_priv(p);
  if (plVar3 == (long *)0x0) {
    pVar6 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    uVar1 = 0;
    do {
      uVar7 = uVar1;
      if ((int)uVar7 == 10) {
        return PARSE_ERROR_INTERNAL;
      }
      pcVar4 = format("label%d",uVar7 + 1 & 0xffffffff);
      _Var2 = parser_hasval(p,pcVar4);
      uVar1 = uVar7 + 1;
    } while (!_Var2);
    n = (wchar_t)(uVar7 + 1);
    pcVar4 = format("label%d",uVar7 + 1 & 0xffffffff);
    pcVar4 = parser_getstr(p,pcVar4);
    sVar5 = text_mbstowcs(*(wchar_t **)(*plVar3 + 0x28 + uVar7 * 8),pcVar4,n);
    pVar6 = PARSE_ERROR_INVALID_VALUE;
    if (sVar5 != 0xffffffffffffffff) {
      wVar8 = (wchar_t)sVar5;
      if (wVar8 <= n) {
        n = wVar8;
      }
      sVar5 = text_mbstowcs((wchar_t *)((long)n * 4 + *(long *)(*plVar3 + 0x28 + uVar7 * 8)),"",
                            L'\x01');
      if (sVar5 != 0xffffffffffffffff) {
        *(wchar_t *)(*plVar3 + 0x17c + uVar7 * 4) = wVar8;
        pVar6 = PARSE_ERROR_NONE;
      }
    }
  }
  return pVar6;
}

Assistant:

static enum parser_error parse_entry_shortened_label(struct parser *p)
{
	struct embryonic_ui_entry *embryo = parser_priv(p);
	int n = 1;
	const char *name;
	size_t nw;

	if (!embryo) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	while (1) {
		if (n > MAX_SHORTENED) {
			return PARSE_ERROR_INTERNAL;
		}
		if (parser_hasval(p, format("label%d", n))) {
			break;
		}
		++n;
	}
	name = parser_getstr(p, format("label%d", n));
	nw = text_mbstowcs(embryo->entry->shortened_labels[n - 1], name, n);
	if (nw != (size_t) -1) {
		/* Ensure null termination. */
		size_t nw2 = text_mbstowcs(
			embryo->entry->shortened_labels[n - 1] +
			((int)nw < n ? (int)nw : n), "", 1);

		if (nw2 != (size_t)-1) {
			embryo->entry->nshortened[n - 1] = nw;
		} else {
			return PARSE_ERROR_INVALID_VALUE;
		}
	} else {
		return PARSE_ERROR_INVALID_VALUE;
	}
	return PARSE_ERROR_NONE;
}